

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_basename(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  sxi32 sVar2;
  bool bVar3;
  char *local_68;
  sxu32 local_5c;
  char *pcStack_58;
  int nSuffix;
  char *zSuffix;
  int local_48;
  int iLen;
  int d;
  int c;
  char *zEnd;
  char *zBase;
  char *zPath;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zPath = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if ((nArg < 1) || (iVar1 = jx9_value_is_string(*apArg), iVar1 == 0)) {
    jx9_result_string(pjStack_18,"",0);
  }
  else {
    local_48 = 0x2f;
    iLen = 0x2f;
    zBase = jx9_value_to_string(*(jx9_value **)zPath,(int *)((long)&zSuffix + 4));
    if (zSuffix._4_4_ < 1) {
      jx9_result_string(pjStack_18,"",0);
    }
    else {
      _d = zBase + (zSuffix._4_4_ + -1);
      while( true ) {
        bVar3 = false;
        if ((zBase < _d) && (bVar3 = true, *_d != iLen)) {
          bVar3 = *_d == local_48;
        }
        if (!bVar3) break;
        _d = _d + -1;
      }
      zSuffix._4_4_ = ((int)_d + 1) - (int)zBase;
      while( true ) {
        bVar3 = false;
        if ((zBase < _d) && (bVar3 = false, *_d != iLen)) {
          bVar3 = *_d != local_48;
        }
        if (!bVar3) break;
        _d = _d + -1;
      }
      local_68 = zBase;
      if (zBase < _d) {
        local_68 = _d + 1;
      }
      zEnd = local_68;
      _d = zBase + zSuffix._4_4_;
      if ((((1 < apArg_local._4_4_) &&
           (iVar1 = jx9_value_is_string(*(jx9_value **)(zPath + 8)), iVar1 != 0)) &&
          (pcStack_58 = jx9_value_to_string(*(jx9_value **)(zPath + 8),(int *)&local_5c),
          0 < (int)local_5c)) &&
         (((int)local_5c < zSuffix._4_4_ &&
          (sVar2 = SyMemcmp(_d + (int)-local_5c,pcStack_58,local_5c), sVar2 == 0)))) {
        _d = _d + -(long)(int)local_5c;
      }
      jx9_result_string(pjStack_18,zEnd,(int)_d - (int)zEnd);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_basename(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zPath, *zBase, *zEnd;
	int c, d, iLen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	c = d = '/';
#ifdef __WINNT__
	d = '\\';
#endif
	/* Point to the target path */
	zPath = jx9_value_to_string(apArg[0], &iLen);
	if( iLen < 1 ){
		/* Empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	zEnd = &zPath[iLen - 1];
	/* Ignore trailing '/' */
	while( zEnd > zPath && ( (int)zEnd[0] == c || (int)zEnd[0] == d ) ){
		zEnd--;
	}
	iLen = (int)(&zEnd[1]-zPath);
	while( zEnd > zPath && ( (int)zEnd[0] != c && (int)zEnd[0] != d ) ){
		zEnd--;
	}
	zBase = (zEnd > zPath) ? &zEnd[1] : zPath;
	zEnd = &zPath[iLen];
	if( nArg > 1 && jx9_value_is_string(apArg[1]) ){
		const char *zSuffix;
		int nSuffix;
		/* Strip suffix */
		zSuffix = jx9_value_to_string(apArg[1], &nSuffix);
		if( nSuffix > 0 && nSuffix < iLen && SyMemcmp(&zEnd[-nSuffix], zSuffix, nSuffix) == 0 ){
			zEnd -= nSuffix;
		}
	}
	/* Store the basename */
	jx9_result_string(pCtx, zBase, (int)(zEnd-zBase));
	return JX9_OK;
}